

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_utf8_exception.cpp
# Opt level: O0

void __thiscall
argo::json_utf8_exception::json_utf8_exception
          (json_utf8_exception *this,exception_type et,string *s)

{
  char *pcVar1;
  undefined8 uVar2;
  string *s_local;
  exception_type et_local;
  json_utf8_exception *this_local;
  
  json_exception::json_exception(&this->super_json_exception,et);
  *(undefined ***)&this->super_json_exception = &PTR__json_utf8_exception_00132a00;
  this->m_byte_index = 0;
  pcVar1 = get_main_message(this);
  uVar2 = std::__cxx11::string::c_str();
  snprintf((this->super_json_exception).m_message,200,"%s : %s",pcVar1,uVar2);
  return;
}

Assistant:

json_utf8_exception::json_utf8_exception(exception_type et, const string &s) noexcept :
                    json_exception(et), m_byte_index(0)
{
    snprintf(m_message, max_message_length, "%s : %s", get_main_message(), s.c_str());
}